

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::Shader::~Shader(Shader *this)

{
  Shader *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Shader_0013d9b8;
  InfoLog::~InfoLog(&this->infoLog);
  ShaderSource::~ShaderSource(&this->source);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~Shader				(void) {}